

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmMakefile *mf,cmGeneratedFileStream *fout)

{
  uint uVar1;
  cmGlobalGenerator *pcVar2;
  cmMakefile *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  long lVar9;
  pointer ppcVar10;
  string *psVar11;
  _Hash_node_base *p_Var12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string currentDir;
  string makeArgs;
  string make;
  allocator local_d9;
  undefined1 local_d8 [32];
  cmExtraKateGenerator *local_b8;
  string local_b0;
  string local_90;
  int local_6c;
  string local_68;
  cmMakefile *local_48;
  pointer local_40;
  char *local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_b8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_MAKE_PROGRAM","");
  pcVar5 = cmMakefile::GetRequiredDefinition(mf,&local_90);
  std::__cxx11::string::string((string *)&local_68,pcVar5,(allocator *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"CMAKE_KATE_MAKE_ARGUMENTS","");
  pcVar5 = cmMakefile::GetSafeDefinition(mf,&local_b0);
  std::__cxx11::string::string((string *)&local_90,pcVar5,(allocator *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmMakefile::GetHomeOutputDirectory(mf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"",0x1c);
  pcVar6 = cmMakefile::GetHomeOutputDirectory(mf);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)fout +
                    (int)(fout->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3]);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"build\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"all\",\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"clean\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"clean\",\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"quick\": \"",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," -C \\\"",6);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
  }
  else {
    sVar7 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar5,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\\\" ",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"install\",\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"targets\":[\n",0xe);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"all","");
  std::__cxx11::string::string((string *)local_d8,pcVar5,&local_d9);
  AppendTarget(local_b8,fout,&local_b0,&local_68,&local_90,(string *)local_d8,pcVar5);
  if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"clean","");
  std::__cxx11::string::string((string *)local_d8,pcVar5,&local_d9);
  AppendTarget(local_b8,fout,&local_b0,&local_68,&local_90,(string *)local_d8,pcVar5);
  if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (local_b8->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar10 = (pcVar2->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar10 !=
      (pcVar2->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_48 = (*ppcVar10)->Makefile;
      local_40 = ppcVar10;
      pcVar6 = cmMakefile::GetCurrentBinaryDirectory(local_48);
      std::__cxx11::string::string((string *)&local_b0,pcVar6,(allocator *)local_d8);
      pcVar3 = local_48;
      cmMakefile::GetHomeOutputDirectory(local_48);
      local_6c = std::__cxx11::string::compare((char *)&local_b0);
      for (p_Var12 = (pcVar3->Targets)._M_h._M_before_begin._M_nxt;
          p_Var12 != (_Hash_node_base *)0x0; p_Var12 = p_Var12->_M_nxt) {
        psVar11 = (string *)(p_Var12 + 1);
        uVar1 = *(uint *)&p_Var12[0x61]._M_nxt;
        if (uVar1 < 5) {
          AppendTarget(local_b8,fout,psVar11,&local_68,&local_90,&local_b0,pcVar5);
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d8,p_Var12[1]._M_nxt,
                     (long)&(p_Var12[2]._M_nxt)->_M_nxt + (long)p_Var12[1]._M_nxt);
          std::__cxx11::string::append((char *)local_d8);
          AppendTarget(local_b8,fout,(string *)local_d8,&local_68,&local_90,&local_b0,pcVar5);
          if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
        }
        else if (uVar1 == 5) {
          lVar9 = std::__cxx11::string::find((char *)psVar11,0x588dff,0);
          if ((((lVar9 != 0) || (iVar4 = std::__cxx11::string::compare((char *)psVar11), iVar4 == 0)
               ) && ((lVar9 = std::__cxx11::string::find((char *)psVar11,0x588cfb,0), lVar9 != 0 ||
                     (iVar4 = std::__cxx11::string::compare((char *)psVar11), iVar4 == 0)))) &&
             ((lVar9 = std::__cxx11::string::find((char *)psVar11,0x588d7a,0), lVar9 != 0 ||
              (iVar4 = std::__cxx11::string::compare((char *)psVar11), iVar4 == 0)))) {
            AppendTarget(local_b8,fout,psVar11,&local_68,&local_90,&local_b0,pcVar5);
          }
        }
        else if ((uVar1 == 6) && (local_6c == 0)) {
          iVar4 = std::__cxx11::string::compare((char *)psVar11);
          if (iVar4 == 0) {
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,"CMAKE_EDIT_COMMAND","");
            pcVar6 = cmMakefile::GetDefinition(local_48,(string *)local_d8);
            if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
              local_38 = pcVar6;
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
              pcVar6 = local_38;
            }
            if ((pcVar6 == (char *)0x0) || (pcVar6 = strstr(pcVar6,"ccmake"), pcVar6 != (char *)0x0)
               ) goto LAB_004415dc;
          }
          AppendTarget(local_b8,fout,psVar11,&local_68,&local_90,&local_b0,pcVar5);
        }
LAB_004415dc:
      }
      local_d8._0_8_ = (string *)0x0;
      local_d8._8_8_ = (string *)0x0;
      local_d8._16_8_ = 0;
      (*(*local_40)->_vptr_cmLocalGenerator[0xb])(*local_40,local_d8);
      for (psVar11 = (string *)local_d8._0_8_; psVar11 != (string *)local_d8._8_8_;
          psVar11 = psVar11 + 1) {
        AppendTarget(local_b8,fout,psVar11,&local_68,&local_90,&local_b0,pcVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      ppcVar10 = local_40 + 1;
    } while (ppcVar10 !=
             (((local_b8->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
             LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t] }\n",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
cmExtraKateGenerator::WriteTargets(const cmMakefile* mf,
                                   cmGeneratedFileStream& fout) const
{
  const std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
    "CMAKE_KATE_MAKE_ARGUMENTS");
  const char* homeOutputDir = mf->GetHomeOutputDirectory();

  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << mf->GetHomeOutputDirectory() << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "install\",\n";

  // this is for kate >= 4.13:
  fout <<
  "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs,
                     homeOutputDir, homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs,
                     homeOutputDir, homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator
       it = this->GlobalGenerator->GetLocalGenerators().begin();
       it != this->GlobalGenerator->GetLocalGenerators().end();
       ++it)
    {
    const cmTargets& targets = (*it)->GetMakefile()->GetTargets();
    cmMakefile* makefile=(*it)->GetMakefile();
    std::string currentDir = makefile->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == makefile->GetHomeOutputDirectory());

    for(cmTargets::const_iterator ti=targets.begin(); ti!=targets.end(); ++ti)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel)
            {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (ti->first == "edit_cache")
              {
              const char* editCommand = makefile->GetDefinition
              ("CMAKE_EDIT_COMMAND");
              if (editCommand == 0)
                {
                insertTarget = false;
                }
              else if (strstr(editCommand, "ccmake")!=NULL)
                {
                insertTarget = false;
                }
              }
            }
          if (insertTarget)
            {
            this->AppendTarget(fout, ti->first, make, makeArgs,
                               currentDir, homeOutputDir);
            }
        }
        break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
            || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
            || ((ti->first.find("Experimental")==0)
            && (ti->first!="Experimental")))
            {
              break;
            }

            this->AppendTarget(fout, ti->first, make, makeArgs,
                               currentDir, homeOutputDir);
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
        {
          this->AppendTarget(fout, ti->first, make, makeArgs,
                             currentDir, homeOutputDir);
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs,
                             currentDir, homeOutputDir);

        }
        break;
        default:
          break;
      }
    }

    //insert rules for compiling, preprocessing and assembling individual files
    std::vector<std::string> objectFileTargets;
    (*it)->GetIndividualFileTargets(objectFileTargets);
    for(std::vector<std::string>::const_iterator fit=objectFileTargets.begin();
        fit != objectFileTargets.end();
        ++fit)
      {
      this->AppendTarget(fout, *fit, make, makeArgs, currentDir,homeOutputDir);
      }
  }

  fout <<
  "\t] }\n";
}